

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

int setbf(match *res,bitfield *bf,ull num)

{
  int iVar1;
  ulong num_00;
  ull uVar2;
  ull mask;
  int j;
  int max;
  ull onum;
  ull num_local;
  bitfield *bf_local;
  match *res_local;
  
  onum = num - bf->addend ^ bf->xorend;
  if (bf->lut != (ull *)0x0) {
    iVar1 = 1 << ((char)bf->sbf[0].len + (char)bf->sbf[1].len & 0x1fU);
    for (mask._0_4_ = 0; ((int)mask < iVar1 && (bf->lut[(int)mask] != onum));
        mask._0_4_ = (int)mask + 1) {
    }
    if ((int)mask == iVar1) {
      return 0;
    }
    onum = (ull)(int)mask;
  }
  num_00 = onum >> ((byte)bf->shr & 0x3f);
  setsbf(res,bf->sbf[0].pos,bf->sbf[0].len,num_00);
  setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,num_00 >> ((byte)bf->sbf[0].len & 0x3f));
  uVar2 = getbf_as(bf,res->a,res->m);
  return (uint)(uVar2 == num);
}

Assistant:

static int setbf (struct match *res, const struct bitfield *bf, ull num) {
	ull onum = num;
	num = (num - bf->addend) ^ bf->xorend;
	if (bf->lut) {
		int max = 1 << (bf->sbf[0].len + bf->sbf[1].len);
		int j = 0;
		for (j = 0; j < max; j++)
			if (bf->lut[j] == num)
				break;
		if (j == max)
			return 0;
		num = j;
	}
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	return (getbf_as(bf, res->a, res->m) & mask) == (onum & mask);
}